

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char ** PHYSFS_enumerateFiles(char *path)

{
  char *pcVar1;
  int iVar2;
  PHYSFS_ErrorCode PVar3;
  uint local_30;
  PHYSFS_uint32 i;
  PHYSFS_ErrorCode errcode;
  EnumStringListCallbackData ecd;
  char *path_local;
  
  ecd._8_8_ = path;
  memset(&i,0,0x10);
  _i = (char *)(*__PHYSFS_AllocatorHooks.Malloc)(8);
  if (_i == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    path_local = (char *)0x0;
  }
  else {
    iVar2 = PHYSFS_enumerate((char *)ecd._8_8_,enumFilesCallback,&i);
    if (iVar2 == 0) {
      PVar3 = currentErrorCode();
      for (local_30 = 0; local_30 < (uint)ecd.list; local_30 = local_30 + 1) {
        (*__PHYSFS_AllocatorHooks.Free)(*(void **)(_i + (ulong)local_30 * 8));
      }
      (*__PHYSFS_AllocatorHooks.Free)(_i);
      if (PVar3 == PHYSFS_ERR_APP_CALLBACK) {
        if (ecd.list._4_4_ != PHYSFS_ERR_OK) {
          PHYSFS_setErrorCode(ecd.list._4_4_);
        }
        path_local = (char *)0x0;
      }
      else {
        path_local = (char *)0x0;
      }
    }
    else {
      pcVar1 = _i + (ulong)(uint)ecd.list * 8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      path_local = _i;
    }
  }
  return (char **)path_local;
}

Assistant:

char **PHYSFS_enumerateFiles(const char *path)
{
    EnumStringListCallbackData ecd;
    memset(&ecd, '\0', sizeof (ecd));
    ecd.list = (char **) allocator.Malloc(sizeof (char *));
    BAIL_IF(!ecd.list, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    if (!PHYSFS_enumerate(path, enumFilesCallback, &ecd))
    {
        const PHYSFS_ErrorCode errcode = currentErrorCode();
        PHYSFS_uint32 i;
        for (i = 0; i < ecd.size; i++)
            allocator.Free(ecd.list[i]);
        allocator.Free(ecd.list);
        BAIL_IF(errcode == PHYSFS_ERR_APP_CALLBACK, ecd.errcode, NULL);
        return NULL;
    } /* if */

    ecd.list[ecd.size] = NULL;
    return ecd.list;
}